

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageTest::iterate(SwapBuffersWithDamageTest *this)

{
  GLES2Renderer *this_00;
  NativeWindow *pNVar1;
  EGLDisplay pvVar2;
  EGLSurface pvVar3;
  EGLint width_00;
  EGLint height_00;
  deUint32 dVar4;
  deBool dVar5;
  Library *egl_00;
  const_reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  int iVar9;
  float x_;
  Vector<int,_2> local_bc;
  Vector<int,_2> local_b4;
  Vector<int,_2> local_ac;
  Vector<int,_2> local_a4;
  int local_9c;
  undefined1 local_98 [4];
  int ndx;
  vector<int,_std::allocator<int>_> damageRegion;
  int currentFrameNdx;
  int iterationNdx;
  FrameSequence frameSequence;
  undefined1 local_58 [4];
  int numFrames;
  Vec4 clearColor;
  float clearBlue;
  float clearGreen;
  float clearRed;
  int height;
  int width;
  Library *egl;
  Random rnd;
  SwapBuffersWithDamageTest *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)&egl,this->m_seed);
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  width_00 = eglu::querySurfaceInt(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3057);
  height_00 = eglu::querySurfaceInt(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3056);
  x_ = de::Random::getFloat((Random *)&egl);
  clearColor.m_data[3] = de::Random::getFloat((Random *)&egl);
  clearColor.m_data[2] = de::Random::getFloat((Random *)&egl);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_58,x_,clearColor.m_data[3],clearColor.m_data[2],1.0);
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x18;
  generateFrameSequence
            ((FrameSequence *)&currentFrameNdx,&this->m_frameDrawType,(Random *)&egl,0x18,width_00,
             height_00);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  do {
    (*egl_00->_vptr_Library[0x30])(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
    dVar4 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar4,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                     ,0x19b);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  for (damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < this->m_iterationTimes;
      damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    for (damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        (int)damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage < 0x18;
        damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      pvVar6 = std::
               vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               ::operator[]((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                             *)&currentFrameNdx,
                            (long)(int)damageRegion.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      getDamageRegion((vector<int,_std::allocator<int>_> *)local_98,pvVar6);
      clearColorScreen(&this->m_gl,(Vec4 *)local_58);
      for (local_9c = 0;
          local_9c <=
          (int)damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_9c = local_9c + 1) {
        this_00 = this->m_gles2Renderer;
        pvVar6 = std::
                 vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 ::operator[]((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                               *)&currentFrameNdx,(long)local_9c);
        GLES2Renderer::render(this_00,width_00,height_00,pvVar6);
      }
      if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
        if (damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ % 2 == 0) {
          pNVar1 = this->m_window;
          tcu::Vector<int,_2>::Vector(&local_a4,width_00 * 2,height_00 / 2);
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&local_a4);
        }
        else {
          pNVar1 = this->m_window;
          tcu::Vector<int,_2>::Vector(&local_ac,height_00 / 2,width_00 * 2);
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&local_ac);
        }
      }
      do {
        pvVar2 = this->m_eglDisplay;
        pvVar3 = this->m_eglSurface;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_98,0);
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_98);
        iVar9 = (int)sVar8;
        if (iVar9 < 0) {
          iVar9 = iVar9 + 3;
        }
        (*egl_00->_vptr_Library[0x32])(egl_00,pvVar2,pvVar3,pvVar7,(ulong)(uint)(iVar9 >> 2));
        dVar4 = (*egl_00->_vptr_Library[0x1f])();
        eglu::checkError(dVar4,
                         "swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                         ,0x1af);
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
        if (damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ % 2 == 0) {
          pNVar1 = this->m_window;
          tcu::Vector<int,_2>::Vector(&local_b4,width_00 * 2,height_00 / 2);
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&local_b4);
        }
        else {
          pNVar1 = this->m_window;
          tcu::Vector<int,_2>::Vector(&local_bc,height_00 / 2,width_00 * 2);
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&local_bc);
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98)
      ;
    }
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             *)&currentFrameNdx);
  de::Random::~Random((Random *)&egl);
  return STOP;
}

Assistant:

TestCase::IterateResult SwapBuffersWithDamageTest::iterate (void)
{
	de::Random			rnd				(m_seed);
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const int			width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int			height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float			clearRed		= rnd.getFloat();
	const float			clearGreen		= rnd.getFloat();
	const float			clearBlue		= rnd.getFloat();
	const tcu::Vec4		clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int			numFrames		= 24; // (width, height) = (480, 480) --> numFrame = 24, divisible
	const FrameSequence frameSequence	= generateFrameSequence(m_frameDrawType, rnd, numFrames, width, height);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int iterationNdx = 0; iterationNdx < m_iterationTimes; iterationNdx++)
	{
		for (int currentFrameNdx = 0; currentFrameNdx < numFrames; currentFrameNdx++)
		{
			vector<EGLint>	damageRegion = getDamageRegion(frameSequence[currentFrameNdx]);

			clearColorScreen(m_gl, clearColor);
			for (int ndx = 0; ndx <= currentFrameNdx; ndx++)
				m_gles2Renderer->render(width, height, frameSequence[ndx]);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}
		}
	}
	return STOP;
}